

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  GLFWwindow *handle;
  GLFWwindow *window;
  char **argv_local;
  int argc_local;
  
  glfwSetErrorCallback(anon_unknown.dwarf_c3::errorCallback);
  handle = anon_unknown.dwarf_c3::initialize();
  if (handle != (GLFWwindow *)0x0) {
    (*glad_glClearColor)(0.15,0.6,0.4,1.0);
    while (iVar1 = glfwWindowShouldClose(handle), iVar1 == 0) {
      (*glad_glClear)(0x4000);
      glfwSwapBuffers(handle);
      glfwPollEvents();
    }
    glfwDestroyWindow(handle);
    glfwTerminate();
  }
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
   glfwSetErrorCallback(errorCallback);

   GLFWwindow* window = initialize();
   if (!window) {
      return 0;
   }

   // Set the clear color to a nice green
   glClearColor(0.15f, 0.6f, 0.4f, 1.0f);

   while (!glfwWindowShouldClose(window)) {
      glClear(GL_COLOR_BUFFER_BIT);

      glfwSwapBuffers(window);
      glfwPollEvents();
   }

   glfwDestroyWindow(window);
   glfwTerminate();

   return 0;
}